

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::Builtins::registerSystemTasks(Builtins *this)

{
  initializer_list<const_slang::ast::Type_*> __l;
  initializer_list<const_slang::ast::Type_*> __l_00;
  initializer_list<const_slang::ast::Type_*> __l_01;
  initializer_list<const_slang::ast::Type_*> __l_02;
  initializer_list<const_slang::ast::Type_*> __l_03;
  initializer_list<const_slang::ast::Type_*> __l_04;
  initializer_list<const_slang::ast::Type_*> __l_05;
  initializer_list<const_slang::ast::Type_*> __l_06;
  initializer_list<const_slang::ast::Type_*> __l_07;
  initializer_list<const_slang::ast::Type_*> __l_08;
  initializer_list<const_slang::ast::Type_*> __l_09;
  initializer_list<const_slang::ast::Type_*> __l_10;
  initializer_list<const_slang::ast::Type_*> __l_11;
  initializer_list<const_slang::ast::Type_*> __l_12;
  initializer_list<const_slang::ast::Type_*> __l_13;
  initializer_list<const_slang::ast::Type_*> __l_14;
  initializer_list<const_slang::ast::Type_*> __l_15;
  long in_RDI;
  int i;
  shared_ptr<slang::ast::builtins::AssertControlTask> *in_stack_ffffffffffffe438;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_ffffffffffffe440;
  shared_ptr<slang::ast::SystemSubroutine> *this_00;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
  *in_stack_ffffffffffffe450;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
  *in_stack_ffffffffffffe460;
  int *__args_3;
  allocator_type *in_stack_ffffffffffffe468;
  KnownSystemName *__args;
  PredefinedIntegerType *in_stack_ffffffffffffe470;
  SubroutineKind *__args_1;
  iterator in_stack_ffffffffffffe478;
  KnownSystemName *__args_00;
  size_type in_stack_ffffffffffffe480;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_ffffffffffffe4d0;
  shared_ptr<slang::ast::SystemSubroutine> *subroutine;
  Builtins *in_stack_ffffffffffffe4d8;
  Builtins *this_01;
  shared_ptr<slang::ast::SystemSubroutine> local_14a0 [2];
  int local_147c;
  undefined4 local_1478;
  undefined4 local_1474;
  undefined4 local_1470;
  undefined4 local_146c;
  undefined4 local_1448;
  undefined4 local_1444;
  undefined4 local_1440;
  undefined4 local_143c;
  int local_1438 [4];
  KnownSystemName local_1428 [4];
  undefined4 local_1418;
  undefined4 local_1414;
  undefined4 local_1410;
  undefined4 local_140c;
  SubroutineKind local_1408 [4];
  KnownSystemName local_13f8 [4];
  undefined4 local_13e8;
  undefined4 local_13e4;
  undefined4 local_13e0;
  undefined4 local_13dc;
  undefined4 local_13b8;
  undefined4 local_13b4;
  undefined4 local_13b0;
  undefined4 local_13ac;
  undefined4 local_1384;
  undefined4 local_135c;
  undefined4 local_1334;
  undefined4 local_130c;
  shared_ptr<slang::ast::SystemSubroutine> local_1308;
  undefined1 local_12f8 [264];
  long local_11f0;
  long *local_11e8;
  char *local_11e0;
  SymbolIndex local_11c0;
  undefined4 local_11bc;
  allocator<const_slang::ast::Type_*> local_1191;
  size_t local_1190;
  size_t *local_1188;
  SourceLocation local_1180;
  undefined4 local_1160;
  undefined4 local_115c;
  allocator<const_slang::ast::Type_*> local_1131;
  char *local_1130;
  SourceLocation local_1128;
  Scope *local_1120;
  undefined4 local_1100;
  undefined4 local_10fc;
  allocator<const_slang::ast::Type_*> local_10d1;
  SourceLocation local_10d0;
  Symbol *local_10c8;
  Symbol *local_10c0;
  bitwidth_t local_10a0;
  undefined4 local_109c;
  allocator<const_slang::ast::Type_*> local_1071;
  Symbol *local_1070;
  Symbol *local_1068;
  Symbol *local_1060;
  SyntaxNode *local_1058;
  Type *local_1050;
  undefined4 local_1030;
  undefined4 local_102c;
  undefined8 local_1008;
  SyntaxNode *pSStack_1000;
  Type *local_ff8;
  bitwidth_t local_ff0;
  undefined4 local_fec;
  allocator<const_slang::ast::Type_*> local_fc1;
  Scope *local_fc0;
  Symbol *local_fb8;
  undefined8 local_fb0;
  Kind local_f90;
  undefined4 local_f8c;
  Scope *local_f68;
  Symbol *pSStack_f60;
  undefined8 local_f58;
  undefined4 local_f48;
  undefined4 local_f44;
  allocator<const_slang::ast::Type_*> local_f19;
  SourceLocation local_f18;
  Symbol *local_f10;
  Symbol *local_f08;
  bitwidth_t local_ee8;
  undefined4 local_ee4;
  allocator<const_slang::ast::Type_*> local_eb9;
  Scope *local_eb8;
  Symbol *local_eb0;
  undefined8 local_ea8;
  Kind local_e88;
  undefined4 local_e84;
  allocator<const_slang::ast::Type_*> local_e59;
  Symbol *local_e58;
  Symbol **local_e50;
  SyntaxNode *local_e48;
  SymbolKind local_e28;
  undefined4 local_e24;
  allocator<const_slang::ast::Type_*> local_df9;
  Type local_df8;
  allocator<const_slang::ast::Type_*> local_d91;
  long local_d90;
  long *local_d88;
  size_t local_d80;
  undefined4 local_d60;
  undefined4 local_d5c;
  allocator<const_slang::ast::Type_*> local_d31;
  size_t local_d30;
  size_t *local_d28;
  SourceLocation local_d20;
  undefined4 local_d00;
  undefined4 local_cfc;
  allocator<const_slang::ast::Type_*> local_cd1;
  Scope *local_cd0;
  Symbol *local_cc8;
  undefined8 local_cc0;
  undefined4 local_ca0;
  undefined4 local_c9c;
  undefined8 local_c78;
  SyntaxNode *pSStack_c70;
  Type *local_c68;
  SymbolKind local_c60;
  undefined4 local_c5c;
  allocator<const_slang::ast::Type_*> local_c31;
  SyntaxNode local_c30 [2];
  SourceLocation local_c00 [5];
  Type *local_bd8;
  Symbol SStack_bd0;
  Type *pTStack_b90;
  Symbol local_b88;
  Type *local_b48;
  SymbolKind local_b40;
  undefined4 local_b3c;
  allocator<const_slang::ast::Type_*> local_b11;
  SyntaxNode local_b10 [2];
  SourceLocation local_ae0 [5];
  Type *local_ab8;
  Symbol SStack_ab0;
  Type *pTStack_a70;
  undefined1 local_a68 [64];
  Type *local_a28;
  Type *local_a20;
  pointer local_a18;
  Type *local_a10;
  Type **local_a08;
  size_t local_a00;
  undefined4 local_9e0;
  undefined4 local_9dc;
  size_t local_9b8;
  size_t sStack_9b0;
  undefined8 local_9a8;
  undefined4 local_998;
  undefined4 local_994;
  undefined1 local_96d;
  undefined4 local_96c;
  undefined1 local_945;
  undefined4 local_944;
  allocator<const_slang::ast::Type_*> local_8b9;
  long local_8b8;
  long *local_8b0;
  undefined8 local_8a8;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_85c;
  undefined4 local_834;
  undefined1 local_80d;
  undefined4 local_80c;
  undefined1 local_7e5;
  undefined4 local_7e4;
  undefined1 local_7bd;
  undefined4 local_7bc;
  undefined1 local_795;
  undefined4 local_794;
  undefined1 local_76d;
  undefined4 local_76c;
  undefined1 local_745;
  undefined4 local_744;
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6d0;
  undefined4 local_6cc;
  undefined4 local_6a4;
  undefined4 local_67c;
  undefined4 local_654;
  undefined4 local_62c;
  undefined4 local_604;
  undefined4 local_5dc;
  undefined4 local_5b4;
  undefined4 local_58c;
  undefined4 local_564;
  undefined4 local_53c;
  undefined4 local_514;
  undefined4 local_4ec;
  undefined4 local_4c4;
  undefined4 local_49c;
  undefined4 local_474;
  undefined4 local_44c;
  undefined4 local_424;
  undefined4 local_3fc;
  undefined4 local_3d4;
  undefined4 local_3ac;
  undefined4 local_384;
  undefined4 local_35c;
  undefined4 local_334;
  undefined4 local_30c;
  undefined4 local_2e4;
  undefined4 local_2bc;
  undefined1 local_295;
  undefined4 local_294;
  undefined1 local_26d;
  undefined4 local_26c;
  undefined1 local_245;
  undefined4 local_244;
  undefined1 local_21d;
  undefined4 local_21c;
  undefined1 local_1f5;
  undefined4 local_1f4;
  undefined1 local_1cd;
  undefined4 local_1cc;
  undefined1 local_1a5;
  undefined4 local_1a4;
  undefined1 local_17d;
  undefined4 local_17c;
  undefined1 local_155;
  undefined4 local_154;
  undefined1 local_12d;
  undefined4 local_12c;
  undefined1 local_105;
  undefined4 local_104;
  undefined1 local_dd;
  undefined4 local_dc;
  undefined1 local_b5;
  undefined4 local_b4;
  undefined1 local_8d;
  undefined4 local_8c;
  undefined1 local_65;
  undefined4 local_64;
  undefined1 local_2d;
  undefined4 local_2c;
  
  local_2c = 0x87;
  local_2d = 2;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::DisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::DisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1394a28);
  std::shared_ptr<slang::ast::builtins::DisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DisplayTask> *)0x1394a35);
  local_64 = 0x88;
  local_65 = 0;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::DisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::DisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1394aae);
  std::shared_ptr<slang::ast::builtins::DisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DisplayTask> *)0x1394abb);
  local_8c = 0x89;
  local_8d = 1;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::DisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::DisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1394b34);
  std::shared_ptr<slang::ast::builtins::DisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DisplayTask> *)0x1394b41);
  local_b4 = 0x8a;
  local_b5 = 3;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::DisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::DisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1394bba);
  std::shared_ptr<slang::ast::builtins::DisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DisplayTask> *)0x1394bc7);
  local_dc = 0x8b;
  local_dd = 2;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::DisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::DisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1394c40);
  std::shared_ptr<slang::ast::builtins::DisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DisplayTask> *)0x1394c4d);
  local_104 = 0x8c;
  local_105 = 0;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::DisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::DisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1394cc6);
  std::shared_ptr<slang::ast::builtins::DisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DisplayTask> *)0x1394cd3);
  local_12c = 0x8d;
  local_12d = 1;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::DisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::DisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1394d4c);
  std::shared_ptr<slang::ast::builtins::DisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DisplayTask> *)0x1394d59);
  local_154 = 0x8e;
  local_155 = 3;
  std::
  make_shared<slang::ast::builtins::DisplayTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::DisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::DisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1394dd2);
  std::shared_ptr<slang::ast::builtins::DisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DisplayTask> *)0x1394ddf);
  local_17c = 0x8f;
  local_17d = 2;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::MonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::MonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1394e58);
  std::shared_ptr<slang::ast::builtins::MonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::MonitorTask> *)0x1394e65);
  local_1a4 = 0x90;
  local_1a5 = 0;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::MonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::MonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1394ede);
  std::shared_ptr<slang::ast::builtins::MonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::MonitorTask> *)0x1394eeb);
  local_1cc = 0x91;
  local_1cd = 1;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::MonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::MonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1394f64);
  std::shared_ptr<slang::ast::builtins::MonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::MonitorTask> *)0x1394f71);
  local_1f4 = 0x92;
  local_1f5 = 3;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::MonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::MonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1394fea);
  std::shared_ptr<slang::ast::builtins::MonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::MonitorTask> *)0x1394ff7);
  local_21c = 0x93;
  local_21d = 2;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::MonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::MonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395070);
  std::shared_ptr<slang::ast::builtins::MonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::MonitorTask> *)0x139507d);
  local_244 = 0x94;
  local_245 = 0;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::MonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::MonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13950f6);
  std::shared_ptr<slang::ast::builtins::MonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::MonitorTask> *)0x1395103);
  local_26c = 0x95;
  local_26d = 1;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::MonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::MonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139517c);
  std::shared_ptr<slang::ast::builtins::MonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::MonitorTask> *)0x1395189);
  local_294 = 0x96;
  local_295 = 3;
  std::
  make_shared<slang::ast::builtins::MonitorTask,slang::parsing::KnownSystemName,slang::LiteralBase>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(LiteralBase *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::MonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::MonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395202);
  std::shared_ptr<slang::ast::builtins::MonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::MonitorTask> *)0x139520f);
  local_2bc = 0x97;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileDisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileDisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395278);
  std::shared_ptr<slang::ast::builtins::FileDisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileDisplayTask> *)0x1395285);
  local_2e4 = 0x98;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileDisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileDisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13952ee);
  std::shared_ptr<slang::ast::builtins::FileDisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileDisplayTask> *)0x13952fb);
  local_30c = 0x99;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileDisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileDisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395364);
  std::shared_ptr<slang::ast::builtins::FileDisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileDisplayTask> *)0x1395371);
  local_334 = 0x9a;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileDisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileDisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13953da);
  std::shared_ptr<slang::ast::builtins::FileDisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileDisplayTask> *)0x13953e7);
  local_35c = 0x9b;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileDisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileDisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395450);
  std::shared_ptr<slang::ast::builtins::FileDisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileDisplayTask> *)0x139545d);
  local_384 = 0x9c;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileDisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileDisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13954c6);
  std::shared_ptr<slang::ast::builtins::FileDisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileDisplayTask> *)0x13954d3);
  local_3ac = 0x9d;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileDisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileDisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139553c);
  std::shared_ptr<slang::ast::builtins::FileDisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileDisplayTask> *)0x1395549);
  local_3d4 = 0x9e;
  std::make_shared<slang::ast::builtins::FileDisplayTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileDisplayTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileDisplayTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13955b2);
  std::shared_ptr<slang::ast::builtins::FileDisplayTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileDisplayTask> *)0x13955bf);
  local_3fc = 0x9f;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileMonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileMonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395628);
  std::shared_ptr<slang::ast::builtins::FileMonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileMonitorTask> *)0x1395635);
  local_424 = 0xa0;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileMonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileMonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139569e);
  std::shared_ptr<slang::ast::builtins::FileMonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileMonitorTask> *)0x13956ab);
  local_44c = 0xa1;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileMonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileMonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395714);
  std::shared_ptr<slang::ast::builtins::FileMonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileMonitorTask> *)0x1395721);
  local_474 = 0xa2;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileMonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileMonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139578a);
  std::shared_ptr<slang::ast::builtins::FileMonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileMonitorTask> *)0x1395797);
  local_49c = 0xa3;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileMonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileMonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395800);
  std::shared_ptr<slang::ast::builtins::FileMonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileMonitorTask> *)0x139580d);
  local_4c4 = 0xa4;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileMonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileMonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395876);
  std::shared_ptr<slang::ast::builtins::FileMonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileMonitorTask> *)0x1395883);
  local_4ec = 0xa5;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileMonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileMonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13958ec);
  std::shared_ptr<slang::ast::builtins::FileMonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileMonitorTask> *)0x13958f9);
  local_514 = 0xa6;
  std::make_shared<slang::ast::builtins::FileMonitorTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FileMonitorTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FileMonitorTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395962);
  std::shared_ptr<slang::ast::builtins::FileMonitorTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FileMonitorTask> *)0x139596f);
  local_53c = 0xa7;
  std::make_shared<slang::ast::builtins::StringOutputTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringOutputTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::StringOutputTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13959d8);
  std::shared_ptr<slang::ast::builtins::StringOutputTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::StringOutputTask> *)0x13959e5);
  local_564 = 0xa8;
  std::make_shared<slang::ast::builtins::StringOutputTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringOutputTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::StringOutputTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395a4e);
  std::shared_ptr<slang::ast::builtins::StringOutputTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::StringOutputTask> *)0x1395a5b);
  local_58c = 0xa9;
  std::make_shared<slang::ast::builtins::StringOutputTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringOutputTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::StringOutputTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395ac4);
  std::shared_ptr<slang::ast::builtins::StringOutputTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::StringOutputTask> *)0x1395ad1);
  local_5b4 = 0xaa;
  std::make_shared<slang::ast::builtins::StringOutputTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringOutputTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::StringOutputTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395b3a);
  std::shared_ptr<slang::ast::builtins::StringOutputTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::StringOutputTask> *)0x1395b47);
  local_5dc = 0xab;
  std::make_shared<slang::ast::builtins::StringFormatTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StringFormatTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::StringFormatTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395bb0);
  std::shared_ptr<slang::ast::builtins::StringFormatTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::StringFormatTask> *)0x1395bbd);
  local_604 = 0xac;
  std::make_shared<slang::ast::builtins::PrintTimeScaleTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::PrintTimeScaleTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::PrintTimeScaleTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395c26);
  std::shared_ptr<slang::ast::builtins::PrintTimeScaleTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::PrintTimeScaleTask> *)0x1395c33);
  local_62c = 0xad;
  std::make_shared<slang::ast::builtins::DumpVarsTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::DumpVarsTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::DumpVarsTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395c9c);
  std::shared_ptr<slang::ast::builtins::DumpVarsTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DumpVarsTask> *)0x1395ca9);
  local_654 = 0xae;
  std::make_shared<slang::ast::builtins::DumpPortsTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::DumpPortsTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::DumpPortsTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395d12);
  std::shared_ptr<slang::ast::builtins::DumpPortsTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::DumpPortsTask> *)0x1395d1f);
  local_67c = 0xaf;
  std::make_shared<slang::ast::builtins::ShowVarsTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::ShowVarsTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::ShowVarsTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395d88);
  std::shared_ptr<slang::ast::builtins::ShowVarsTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ShowVarsTask> *)0x1395d95);
  local_6a4 = 0x77;
  std::make_shared<slang::ast::builtins::CastTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::CastTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::CastTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395dfe);
  std::shared_ptr<slang::ast::builtins::CastTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::CastTask> *)0x1395e0b);
  local_6cc = 0x78;
  local_6d0 = 3;
  std::
  make_shared<slang::ast::builtins::SeverityTask,slang::parsing::KnownSystemName,slang::ast::ElabSystemTaskKind>
            ((KnownSystemName *)in_stack_ffffffffffffe468,
             (ElabSystemTaskKind *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::SeverityTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SeverityTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395e87);
  std::shared_ptr<slang::ast::builtins::SeverityTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SeverityTask> *)0x1395e94);
  local_6f4 = 0x79;
  local_6f8 = 2;
  std::
  make_shared<slang::ast::builtins::SeverityTask,slang::parsing::KnownSystemName,slang::ast::ElabSystemTaskKind>
            ((KnownSystemName *)in_stack_ffffffffffffe468,
             (ElabSystemTaskKind *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::SeverityTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SeverityTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395f10);
  std::shared_ptr<slang::ast::builtins::SeverityTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SeverityTask> *)0x1395f1d);
  local_71c = 0x7a;
  local_720 = 1;
  std::
  make_shared<slang::ast::builtins::SeverityTask,slang::parsing::KnownSystemName,slang::ast::ElabSystemTaskKind>
            ((KnownSystemName *)in_stack_ffffffffffffe468,
             (ElabSystemTaskKind *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::SeverityTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SeverityTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1395f99);
  std::shared_ptr<slang::ast::builtins::SeverityTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SeverityTask> *)0x1395fa6);
  local_744 = 0x7b;
  local_745 = 1;
  std::make_shared<slang::ast::builtins::FinishControlTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(bool *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FinishControlTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FinishControlTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139601f);
  std::shared_ptr<slang::ast::builtins::FinishControlTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FinishControlTask> *)0x139602c);
  local_76c = 0x7c;
  local_76d = 0;
  std::make_shared<slang::ast::builtins::FinishControlTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(bool *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::FinishControlTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FinishControlTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13960a5);
  std::shared_ptr<slang::ast::builtins::FinishControlTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FinishControlTask> *)0x13960b2);
  local_794 = 0xb0;
  local_795 = 1;
  std::make_shared<slang::ast::builtins::ReadWriteMemTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(bool *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ReadWriteMemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::ReadWriteMemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139612b);
  std::shared_ptr<slang::ast::builtins::ReadWriteMemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ReadWriteMemTask> *)0x1396138);
  local_7bc = 0xb1;
  local_7bd = 1;
  std::make_shared<slang::ast::builtins::ReadWriteMemTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(bool *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ReadWriteMemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::ReadWriteMemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13961b1);
  std::shared_ptr<slang::ast::builtins::ReadWriteMemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ReadWriteMemTask> *)0x13961be);
  local_7e4 = 0xb2;
  local_7e5 = 0;
  std::make_shared<slang::ast::builtins::ReadWriteMemTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(bool *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ReadWriteMemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::ReadWriteMemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1396237);
  std::shared_ptr<slang::ast::builtins::ReadWriteMemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ReadWriteMemTask> *)0x1396244);
  local_80c = 0xb3;
  local_80d = 0;
  std::make_shared<slang::ast::builtins::ReadWriteMemTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(bool *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ReadWriteMemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::ReadWriteMemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13962bd);
  std::shared_ptr<slang::ast::builtins::ReadWriteMemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ReadWriteMemTask> *)0x13962ca);
  local_834 = 0xb4;
  std::make_shared<slang::ast::builtins::SReadMemTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::SReadMemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SReadMemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1396333);
  std::shared_ptr<slang::ast::builtins::SReadMemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SReadMemTask> *)0x1396340);
  local_85c = 0xb5;
  std::make_shared<slang::ast::builtins::SReadMemTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::SReadMemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SReadMemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13963a9);
  std::shared_ptr<slang::ast::builtins::SReadMemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SReadMemTask> *)0x13963b6);
  local_884 = 0xb6;
  local_888 = 0;
  local_8b8 = in_RDI + 0x5c0;
  local_8b0 = &local_8b8;
  local_8a8 = 1;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x1396425);
  __l._M_len = in_stack_ffffffffffffe480;
  __l._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::PredefinedIntegerType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13964bc);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x13964c9);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_8b9);
  std::make_shared<slang::ast::builtins::SdfAnnotateTask>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SdfAnnotateTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SdfAnnotateTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1396539);
  std::shared_ptr<slang::ast::builtins::SdfAnnotateTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SdfAnnotateTask> *)0x1396546);
  std::make_shared<slang::ast::builtins::StaticAssertTask>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StaticAssertTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::StaticAssertTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139659c);
  std::shared_ptr<slang::ast::builtins::StaticAssertTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::StaticAssertTask> *)0x13965a9);
  std::make_shared<slang::ast::builtins::FatalTask>();
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::FatalTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::FatalTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13965ff);
  std::shared_ptr<slang::ast::builtins::FatalTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::FatalTask> *)0x139660c);
  local_944 = 0xb7;
  local_945 = 1;
  std::make_shared<slang::ast::builtins::ScopeTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(bool *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::ScopeTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::ScopeTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1396685);
  std::shared_ptr<slang::ast::builtins::ScopeTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ScopeTask> *)0x1396692);
  local_96c = 0xb8;
  local_96d = 0;
  std::make_shared<slang::ast::builtins::ScopeTask,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_ffffffffffffe468,(bool *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::ScopeTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::ScopeTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139670b);
  std::shared_ptr<slang::ast::builtins::ScopeTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ScopeTask> *)0x1396718);
  local_994 = 0xb9;
  local_998 = 0;
  local_9b8 = 0;
  sStack_9b0 = 0;
  local_9a8 = 0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             0x1396770);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13967e0);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x13967ed);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  local_9dc = 0xba;
  local_9e0 = 0;
  local_a28 = (Type *)(in_RDI + 0x210);
  local_a18 = (pointer)(in_RDI + 0x5c0);
  local_a08 = &local_a28;
  local_a00 = 4;
  local_a20 = local_a28;
  local_a10 = local_a28;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x139688a);
  __l_00._M_len = in_stack_ffffffffffffe480;
  __l_00._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_00,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1396921);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x139692e);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator
            ((allocator<const_slang::ast::Type_*> *)(local_a68 + 0x3f));
  local_a68._20_4_ = 0xbb;
  local_a68._16_4_ = 0;
  SStack_ab0.originatingSyntax = (SyntaxNode *)0x0;
  pTStack_a70 = (Type *)0x0;
  local_a68._0_8_ = 0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             0x13969a0);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1396a10);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1396a1d);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  SStack_ab0.name._M_str._4_4_ = 0xbc;
  SStack_ab0.name._M_str._0_4_ = 0;
  local_ab8 = (Type *)0x0;
  SStack_ab0.kind = Unknown;
  SStack_ab0._4_4_ = 0;
  SStack_ab0.name._M_len = 0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             0x1396a82);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1396af2);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1396aff);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  local_ae0[0]._4_4_ = 0xbd;
  local_ae0[0]._0_4_ = 0;
  local_b10[0]._0_8_ = in_RDI + 0x5c0;
  local_b10[0].parent = local_b10;
  local_b10[0].previewNode = (SyntaxNode *)0x1;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x1396b7b);
  __l_01._M_len = in_stack_ffffffffffffe480;
  __l_01._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_01,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1396c12);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1396c1f);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_b11);
  local_b3c = 0xbe;
  local_b40 = Unknown;
  local_b88.indexInScope = 0;
  local_b88._52_4_ = 0;
  local_b88.originatingSyntax = (SyntaxNode *)0x0;
  local_b48 = (Type *)0x0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             0x1396c91);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1396d01);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1396d0e);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  local_b88.name._M_len._4_4_ = 0xbf;
  local_b88.name._M_len._0_4_ = 0;
  SStack_bd0.originatingSyntax = (SyntaxNode *)0x0;
  pTStack_b90 = (Type *)0x0;
  local_b88.kind = Unknown;
  local_b88._4_4_ = 0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             0x1396d73);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1396de3);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1396df0);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  SStack_bd0.name._M_str._4_4_ = 0xc0;
  SStack_bd0.name._M_str._0_4_ = 0;
  local_bd8 = (Type *)0x0;
  SStack_bd0.kind = Unknown;
  SStack_bd0._4_4_ = 0;
  SStack_bd0.name._M_len = 0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             0x1396e55);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1396ec5);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1396ed2);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  local_c00[0]._4_4_ = 0xc1;
  local_c00[0]._0_4_ = 1;
  local_c30[0]._0_8_ = in_RDI + 0x210;
  local_c30[0].parent = local_c30;
  local_c30[0].previewNode = (SyntaxNode *)0x1;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x1396f4e);
  __l_02._M_len = in_stack_ffffffffffffe480;
  __l_02._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_02,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1396fe5);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1396ff2);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_c31);
  local_c5c = 0xc2;
  local_c60 = Unknown;
  local_c78._0_4_ = 0;
  local_c78._4_4_ = 0;
  pSStack_c70 = (SyntaxNode *)0x0;
  local_c68 = (Type *)0x0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             0x1397064);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13970d4);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x13970e1);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  local_c9c = 0xc3;
  local_ca0 = 0;
  local_cd0 = (Scope *)(in_RDI + 0x5c0);
  local_cc8 = (Symbol *)&local_cd0;
  local_cc0._0_4_ = 1;
  local_cc0._4_4_ = 0;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x139715d);
  __l_03._M_len = in_stack_ffffffffffffe480;
  __l_03._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_03,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13971f4);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1397201);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_cd1);
  local_cfc = 0xc4;
  local_d00 = 0;
  local_d30 = in_RDI + 0x5c0;
  local_d28 = &local_d30;
  local_d20 = (SourceLocation)0x1;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x139728a);
  __l_04._M_len = in_stack_ffffffffffffe480;
  __l_04._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_04,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1397321);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x139732e);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_d31);
  local_d5c = 0xc5;
  local_d60 = 0;
  local_d90 = in_RDI + 0x5c0;
  local_d88 = &local_d90;
  local_d80 = 1;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x13973b7);
  __l_05._M_len = in_stack_ffffffffffffe480;
  __l_05._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_05,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139744e);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x139745b);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_d91);
  local_df8.super_Symbol.originatingSyntax._4_4_ = 0xc6;
  local_df8.super_Symbol.originatingSyntax._0_4_ = 1;
  local_df8.super_Symbol._0_8_ = in_RDI + 0x210;
  local_df8.super_Symbol.name._M_len = in_RDI + 0x5c0;
  local_df8.super_Symbol.name._M_str = (char *)&local_df8;
  local_df8.super_Symbol.location = (SourceLocation)0x2;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x13974f6);
  __l_06._M_len = in_stack_ffffffffffffe480;
  __l_06._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_06,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139758d);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x139759a);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_df9);
  local_e24 = 199;
  local_e28 = Unknown;
  local_e58 = (Symbol *)(in_RDI + 0x5c0);
  local_e50 = &local_e58;
  local_e48 = (SyntaxNode *)0x1;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x1397623);
  __l_07._M_len = in_stack_ffffffffffffe480;
  __l_07._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_07,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13976ba);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x13976c7);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_e59);
  local_e84 = 200;
  local_e88 = Int;
  local_eb8 = (Scope *)(in_RDI + 0x5c0);
  local_eb0 = (Symbol *)&local_eb8;
  local_ea8._0_4_ = 1;
  local_ea8._4_4_ = 0;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x1397750);
  __l_08._M_len = in_stack_ffffffffffffe480;
  __l_08._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_08,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13977e7);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x13977f4);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_eb9);
  local_ee4._0_1_ = true;
  local_ee4._1_1_ = false;
  local_ee4._2_2_ = 0;
  local_ee8 = 0;
  local_f18 = (SourceLocation)(in_RDI + 0x5c0);
  local_f10 = (Symbol *)&local_f18;
  local_f08 = (Symbol *)0x1;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x139787d);
  __l_09._M_len = in_stack_ffffffffffffe480;
  __l_09._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_09,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1397914);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1397921);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_f19);
  local_f44 = 0xca;
  local_f48 = 0;
  local_f68 = (Scope *)0x0;
  pSStack_f60 = (Symbol *)0x0;
  local_f58._0_4_ = 0;
  local_f58._4_4_ = 0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             0x1397993);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1397a03);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1397a10);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  local_f8c = 0xcb;
  local_f90 = ShortInt;
  local_fc0 = (Scope *)(in_RDI + 0x5c0);
  local_fb8 = (Symbol *)&local_fc0;
  local_fb0._0_4_ = 1;
  local_fb0._4_4_ = 0;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x1397a8c);
  __l_10._M_len = in_stack_ffffffffffffe480;
  __l_10._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_10,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1397b23);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1397b30);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_fc1);
  local_fec._0_1_ = true;
  local_fec._1_1_ = false;
  local_fec._2_2_ = 0;
  local_ff0 = 0;
  local_1008._0_4_ = 0;
  local_1008._4_4_ = 0;
  pSStack_1000 = (SyntaxNode *)0x0;
  local_ff8 = (Type *)0x0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             0x1397ba2);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1397c12);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1397c1f);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  local_102c = 0xcd;
  local_1030 = 0;
  local_1070 = (Symbol *)(in_RDI + 0x210);
  local_1058 = (SyntaxNode *)&local_1070;
  local_1050 = (Type *)0x3;
  local_1068 = local_1070;
  local_1060 = local_1070;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x1397cab);
  __l_11._M_len = in_stack_ffffffffffffe480;
  __l_11._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_11,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1397d42);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1397d4f);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_1071);
  local_109c._0_1_ = true;
  local_109c._1_1_ = false;
  local_109c._2_2_ = 0;
  local_10a0 = 1;
  local_10d0 = (SourceLocation)(in_RDI + 0x5c0);
  local_10c8 = (Symbol *)&local_10d0;
  local_10c0 = (Symbol *)0x1;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x1397dd8);
  __l_12._M_len = in_stack_ffffffffffffe480;
  __l_12._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_12,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1397e6f);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1397e7c);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_10d1);
  local_10fc = 0xcf;
  local_1100 = 1;
  local_1130 = (char *)(in_RDI + 0x5c0);
  local_1128 = (SourceLocation)&local_1130;
  local_1120 = (Scope *)0x1;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x1397f05);
  __l_13._M_len = in_stack_ffffffffffffe480;
  __l_13._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_13,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1397f9c);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1397fa9);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_1131);
  local_115c = 0xd0;
  local_1160 = 1;
  local_1190 = in_RDI + 0x5c0;
  local_1188 = &local_1190;
  local_1180 = (SourceLocation)0x1;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x1398032);
  __l_14._M_len = in_stack_ffffffffffffe480;
  __l_14._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_14,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13980c9);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x13980d6);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator(&local_1191);
  local_11bc = 0xd1;
  local_11c0 = 0;
  local_11f0 = in_RDI + 0x210;
  local_11e8 = &local_11f0;
  local_11e0 = (char *)0x1;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0x139815f);
  __l_15._M_len = in_stack_ffffffffffffe480;
  __l_15._M_array = in_stack_ffffffffffffe478;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffe470,__l_15,in_stack_ffffffffffffe468);
  std::
  make_shared<slang::ast::builtins::SimpleSystemTask,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>>
            ((KnownSystemName *)in_stack_ffffffffffffe478,(VoidType *)in_stack_ffffffffffffe470,
             (int *)in_stack_ffffffffffffe468,in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SimpleSystemTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::SimpleSystemTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13981f6);
  std::shared_ptr<slang::ast::builtins::SimpleSystemTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SimpleSystemTask> *)0x1398203);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector
            (in_stack_ffffffffffffe450);
  std::allocator<const_slang::ast::Type_*>::~allocator
            ((allocator<const_slang::ast::Type_*> *)(local_12f8 + 0x107));
  local_12f8._220_4_ = 0x7d;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssertControlTask,void>
            (in_stack_ffffffffffffe440,in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1398286);
  std::shared_ptr<slang::ast::builtins::AssertControlTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssertControlTask> *)0x1398293);
  local_12f8._180_4_ = 0x7e;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssertControlTask,void>
            (in_stack_ffffffffffffe440,in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13982fc);
  std::shared_ptr<slang::ast::builtins::AssertControlTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssertControlTask> *)0x1398309);
  local_12f8._140_4_ = 0x7f;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssertControlTask,void>
            (in_stack_ffffffffffffe440,in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1398372);
  std::shared_ptr<slang::ast::builtins::AssertControlTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssertControlTask> *)0x139837f);
  local_12f8._100_4_ = 0x80;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssertControlTask,void>
            (in_stack_ffffffffffffe440,in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13983e8);
  std::shared_ptr<slang::ast::builtins::AssertControlTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssertControlTask> *)0x13983f5);
  local_12f8._60_4_ = 0x81;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssertControlTask,void>
            (in_stack_ffffffffffffe440,in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139845e);
  std::shared_ptr<slang::ast::builtins::AssertControlTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssertControlTask> *)0x139846b);
  local_12f8._20_4_ = 0x82;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssertControlTask,void>
            (in_stack_ffffffffffffe440,in_stack_ffffffffffffe438);
  addSystemSubroutine(in_stack_ffffffffffffe4d8,in_stack_ffffffffffffe4d0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13984d4);
  std::shared_ptr<slang::ast::builtins::AssertControlTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssertControlTask> *)0x13984e1);
  local_130c = 0x83;
  subroutine = &local_1308;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  this_01 = (Builtins *)local_12f8;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssertControlTask,void>
            (in_stack_ffffffffffffe440,in_stack_ffffffffffffe438);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139854a);
  std::shared_ptr<slang::ast::builtins::AssertControlTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssertControlTask> *)0x1398557);
  local_1334 = 0x84;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssertControlTask,void>
            (in_stack_ffffffffffffe440,in_stack_ffffffffffffe438);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13985c0);
  std::shared_ptr<slang::ast::builtins::AssertControlTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssertControlTask> *)0x13985cd);
  local_135c = 0x85;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssertControlTask,void>
            (in_stack_ffffffffffffe440,in_stack_ffffffffffffe438);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1398630);
  std::shared_ptr<slang::ast::builtins::AssertControlTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssertControlTask> *)0x139863d);
  local_1384 = 0x86;
  std::make_shared<slang::ast::builtins::AssertControlTask,slang::parsing::KnownSystemName>
            ((KnownSystemName *)in_stack_ffffffffffffe468);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::AssertControlTask,void>
            (in_stack_ffffffffffffe440,in_stack_ffffffffffffe438);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139869a);
  std::shared_ptr<slang::ast::builtins::AssertControlTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::AssertControlTask> *)0x13986a7);
  local_13ac = 0xd2;
  local_13b0 = 1;
  local_13b4 = 3;
  local_13b8 = 1;
  std::
  make_shared<slang::ast::builtins::StochasticTask,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            ((KnownSystemName *)in_stack_ffffffffffffe478,
             (SubroutineKind *)in_stack_ffffffffffffe470,(int *)in_stack_ffffffffffffe468,
             (int *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StochasticTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::StochasticTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x139873d);
  std::shared_ptr<slang::ast::builtins::StochasticTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::StochasticTask> *)0x139874a);
  local_13dc = 0xd3;
  local_13e0 = 1;
  local_13e4 = 3;
  local_13e8 = 1;
  std::
  make_shared<slang::ast::builtins::StochasticTask,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            ((KnownSystemName *)in_stack_ffffffffffffe478,
             (SubroutineKind *)in_stack_ffffffffffffe470,(int *)in_stack_ffffffffffffe468,
             (int *)in_stack_ffffffffffffe460);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StochasticTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::StochasticTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13987e0);
  std::shared_ptr<slang::ast::builtins::StochasticTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::StochasticTask> *)0x13987ed);
  local_140c = 0xd4;
  local_1410 = 1;
  local_1414 = 2;
  local_1418 = 2;
  __args_1 = local_1408;
  std::
  make_shared<slang::ast::builtins::StochasticTask,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            ((KnownSystemName *)in_stack_ffffffffffffe478,__args_1,(int *)in_stack_ffffffffffffe468,
             (int *)in_stack_ffffffffffffe460);
  __args_00 = local_13f8;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StochasticTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::StochasticTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1398883);
  std::shared_ptr<slang::ast::builtins::StochasticTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::StochasticTask> *)0x1398890);
  local_143c = 0xd5;
  local_1440 = 1;
  local_1444 = 2;
  local_1448 = 2;
  __args_3 = local_1438;
  std::
  make_shared<slang::ast::builtins::StochasticTask,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            (__args_00,__args_1,(int *)in_stack_ffffffffffffe468,__args_3);
  __args = local_1428;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StochasticTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::StochasticTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1398926);
  std::shared_ptr<slang::ast::builtins::StochasticTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::StochasticTask> *)0x1398933);
  local_146c = 0xd6;
  local_1470 = 0;
  local_1474 = 1;
  local_1478 = 1;
  std::
  make_shared<slang::ast::builtins::StochasticTask,slang::parsing::KnownSystemName,slang::ast::SubroutineKind,int,int>
            (__args_00,__args_1,(int *)__args,__args_3);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::StochasticTask,void>
            (in_stack_ffffffffffffe440,
             (shared_ptr<slang::ast::builtins::StochasticTask> *)in_stack_ffffffffffffe438);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x13989c9);
  std::shared_ptr<slang::ast::builtins::StochasticTask>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::StochasticTask> *)0x13989d6);
  for (local_147c = 0; local_147c < 0x10; local_147c = local_147c + 1) {
    this_00 = local_14a0;
    std::make_shared<slang::ast::builtins::PlaTask,slang::parsing::KnownSystemName>(__args);
    std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::PlaTask,void>
              (this_00,(shared_ptr<slang::ast::builtins::PlaTask> *)in_stack_ffffffffffffe438);
    addSystemSubroutine(this_01,subroutine);
    std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
              ((shared_ptr<slang::ast::SystemSubroutine> *)0x1398a54);
    std::shared_ptr<slang::ast::builtins::PlaTask>::~shared_ptr
              ((shared_ptr<slang::ast::builtins::PlaTask> *)0x1398a61);
  }
  return;
}

Assistant:

void Builtins::registerSystemTasks() {
    using parsing::KnownSystemName;

#define REGISTER(type, name, base) addSystemSubroutine(std::make_shared<type>(name, base))
    REGISTER(DisplayTask, KnownSystemName::Display, LiteralBase::Decimal);
    REGISTER(DisplayTask, KnownSystemName::DisplayB, LiteralBase::Binary);
    REGISTER(DisplayTask, KnownSystemName::DisplayO, LiteralBase::Octal);
    REGISTER(DisplayTask, KnownSystemName::DisplayH, LiteralBase::Hex);
    REGISTER(DisplayTask, KnownSystemName::Write, LiteralBase::Decimal);
    REGISTER(DisplayTask, KnownSystemName::WriteB, LiteralBase::Binary);
    REGISTER(DisplayTask, KnownSystemName::WriteO, LiteralBase::Octal);
    REGISTER(DisplayTask, KnownSystemName::WriteH, LiteralBase::Hex);
    REGISTER(MonitorTask, KnownSystemName::Strobe, LiteralBase::Decimal);
    REGISTER(MonitorTask, KnownSystemName::StrobeB, LiteralBase::Binary);
    REGISTER(MonitorTask, KnownSystemName::StrobeO, LiteralBase::Octal);
    REGISTER(MonitorTask, KnownSystemName::StrobeH, LiteralBase::Hex);
    REGISTER(MonitorTask, KnownSystemName::Monitor, LiteralBase::Decimal);
    REGISTER(MonitorTask, KnownSystemName::MonitorB, LiteralBase::Binary);
    REGISTER(MonitorTask, KnownSystemName::MonitorO, LiteralBase::Octal);
    REGISTER(MonitorTask, KnownSystemName::MonitorH, LiteralBase::Hex);

#undef REGISTER
#define REGISTER(type, name) addSystemSubroutine(std::make_shared<type>(name))
    REGISTER(FileDisplayTask, KnownSystemName::FDisplay);
    REGISTER(FileDisplayTask, KnownSystemName::FDisplayB);
    REGISTER(FileDisplayTask, KnownSystemName::FDisplayO);
    REGISTER(FileDisplayTask, KnownSystemName::FDisplayH);
    REGISTER(FileDisplayTask, KnownSystemName::FWrite);
    REGISTER(FileDisplayTask, KnownSystemName::FWriteB);
    REGISTER(FileDisplayTask, KnownSystemName::FWriteO);
    REGISTER(FileDisplayTask, KnownSystemName::FWriteH);
    REGISTER(FileMonitorTask, KnownSystemName::FStrobe);
    REGISTER(FileMonitorTask, KnownSystemName::FStrobeB);
    REGISTER(FileMonitorTask, KnownSystemName::FStrobeO);
    REGISTER(FileMonitorTask, KnownSystemName::FStrobeH);
    REGISTER(FileMonitorTask, KnownSystemName::FMonitor);
    REGISTER(FileMonitorTask, KnownSystemName::FMonitorB);
    REGISTER(FileMonitorTask, KnownSystemName::FMonitorO);
    REGISTER(FileMonitorTask, KnownSystemName::FMonitorH);

    REGISTER(StringOutputTask, KnownSystemName::SWrite);
    REGISTER(StringOutputTask, KnownSystemName::SWriteB);
    REGISTER(StringOutputTask, KnownSystemName::SWriteO);
    REGISTER(StringOutputTask, KnownSystemName::SWriteH);

    REGISTER(StringFormatTask, KnownSystemName::SFormat);

    REGISTER(PrintTimeScaleTask, KnownSystemName::PrintTimeScale);

    REGISTER(DumpVarsTask, KnownSystemName::DumpVars);
    REGISTER(DumpPortsTask, KnownSystemName::DumpPorts);
    REGISTER(ShowVarsTask, KnownSystemName::ShowVars);

    REGISTER(CastTask, KnownSystemName::Cast);

#undef REGISTER
#define REGISTER(type, name, kind) addSystemSubroutine(std::make_shared<type>(name, kind))
    REGISTER(SeverityTask, KnownSystemName::Info, ElabSystemTaskKind::Info);
    REGISTER(SeverityTask, KnownSystemName::Warning, ElabSystemTaskKind::Warning);
    REGISTER(SeverityTask, KnownSystemName::Error, ElabSystemTaskKind::Error);

#undef REGISTER
#define REGISTER(type, name, isFinish) addSystemSubroutine(std::make_shared<type>(name, isFinish))
    REGISTER(FinishControlTask, KnownSystemName::Finish, true);
    REGISTER(FinishControlTask, KnownSystemName::Stop, false);

#undef REGISTER

    addSystemSubroutine(std::make_shared<ReadWriteMemTask>(KnownSystemName::ReadMemB, true));
    addSystemSubroutine(std::make_shared<ReadWriteMemTask>(KnownSystemName::ReadMemH, true));
    addSystemSubroutine(std::make_shared<ReadWriteMemTask>(KnownSystemName::WriteMemB, false));
    addSystemSubroutine(std::make_shared<ReadWriteMemTask>(KnownSystemName::WriteMemH, false));
    addSystemSubroutine(std::make_shared<SReadMemTask>(KnownSystemName::SReadMemB));
    addSystemSubroutine(std::make_shared<SReadMemTask>(KnownSystemName::SReadMemH));
    addSystemSubroutine(std::make_shared<SimpleSystemTask>(KnownSystemName::System, intType, 0,
                                                           std::vector<const Type*>{&stringType}));
    addSystemSubroutine(std::make_shared<SdfAnnotateTask>());
    addSystemSubroutine(std::make_shared<StaticAssertTask>());
    addSystemSubroutine(std::make_shared<FatalTask>());
    addSystemSubroutine(std::make_shared<ScopeTask>(KnownSystemName::List, true));
    addSystemSubroutine(std::make_shared<ScopeTask>(KnownSystemName::Scope, false));

#define TASK(name, required, ...)                                                    \
    addSystemSubroutine(std::make_shared<SimpleSystemTask>(name, voidType, required, \
                                                           std::vector<const Type*>{__VA_ARGS__}))

    TASK(KnownSystemName::Exit, 0, );

    TASK(KnownSystemName::TimeFormat, 0, &intType, &intType, &stringType, &intType);

    TASK(KnownSystemName::MonitorOn, 0, );
    TASK(KnownSystemName::MonitorOff, 0, );

    TASK(KnownSystemName::DumpFile, 0, &stringType);
    TASK(KnownSystemName::DumpOn, 0, );
    TASK(KnownSystemName::DumpOff, 0, );
    TASK(KnownSystemName::DumpAll, 0, );
    TASK(KnownSystemName::DumpLimit, 1, &intType);
    TASK(KnownSystemName::DumpFlush, 0, );
    TASK(KnownSystemName::DumpPortsOn, 0, &stringType);
    TASK(KnownSystemName::DumpPortsOff, 0, &stringType);
    TASK(KnownSystemName::DumpPortsAll, 0, &stringType);
    TASK(KnownSystemName::DumpPortsLimit, 1, &intType, &stringType);
    TASK(KnownSystemName::DumpPortsFlush, 0, &stringType);

    TASK(KnownSystemName::Input, 1, &stringType);
    TASK(KnownSystemName::Key, 0, &stringType);
    TASK(KnownSystemName::NoKey, 0, );
    TASK(KnownSystemName::Log, 0, &stringType);
    TASK(KnownSystemName::NoLog, 0, );
    TASK(KnownSystemName::Reset, 0, &intType, &intType, &intType);
    TASK(KnownSystemName::Save, 1, &stringType);
    TASK(KnownSystemName::Restart, 1, &stringType);
    TASK(KnownSystemName::IncSave, 1, &stringType);
    TASK(KnownSystemName::ShowScopes, 0, &intType);

#undef TASK

#define ASSERTCTRL(name) addSystemSubroutine(std::make_shared<AssertControlTask>(name))
    ASSERTCTRL(KnownSystemName::AssertControl);
    ASSERTCTRL(KnownSystemName::AssertOn);
    ASSERTCTRL(KnownSystemName::AssertOff);
    ASSERTCTRL(KnownSystemName::AssertKill);
    ASSERTCTRL(KnownSystemName::AssertPassOn);
    ASSERTCTRL(KnownSystemName::AssertPassOff);
    ASSERTCTRL(KnownSystemName::AssertFailOn);
    ASSERTCTRL(KnownSystemName::AssertFailOff);
    ASSERTCTRL(KnownSystemName::AssertNonvacuousOn);
    ASSERTCTRL(KnownSystemName::AssertVacuousOff);

#undef ASSERTCTRL

#define TASK(name, kind, input, output) \
    addSystemSubroutine(std::make_shared<StochasticTask>(name, kind, input, output))
    TASK(KnownSystemName::QInitialize, SubroutineKind::Task, 3, 1);
    TASK(KnownSystemName::QAdd, SubroutineKind::Task, 3, 1);
    TASK(KnownSystemName::QRemove, SubroutineKind::Task, 2, 2);
    TASK(KnownSystemName::QExam, SubroutineKind::Task, 2, 2);
    TASK(KnownSystemName::QFull, SubroutineKind::Function, 1, 1);

#undef TASK

    // There are 16 PLA tasks, with sequential enum values starting with $async$and$array
    for (int i = 0; i < 16; i++) {
        addSystemSubroutine(
            std::make_shared<PlaTask>((KnownSystemName)((int)KnownSystemName::AsyncAndArray + i)));
    }
}